

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O2

UINT8 __thiscall DROPlayer::UnloadFile(DROPlayer *this)

{
  pointer puVar1;
  pointer p_Var2;
  UINT8 UVar3;
  
  UVar3 = 0xff;
  if ((this->_playState & 1) == 0) {
    this->_playState = '\0';
    this->_dLoad = (DATA_LOADER *)0x0;
    this->_fileData = (UINT8 *)0x0;
    (this->_fileHdr).verMajor = 0xff;
    this->_dataOfs = 0;
    puVar1 = (this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar1) {
      (this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    puVar1 = (this->_devPanning).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->_devPanning).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar1) {
      (this->_devPanning).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    p_Var2 = (this->_devices).
             super__Vector_base<_dro_chip_device,_std::allocator<_dro_chip_device>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->_devices).super__Vector_base<_dro_chip_device,_std::allocator<_dro_chip_device>_>.
        _M_impl.super__Vector_impl_data._M_finish != p_Var2) {
      (this->_devices).super__Vector_base<_dro_chip_device,_std::allocator<_dro_chip_device>_>.
      _M_impl.super__Vector_impl_data._M_finish = p_Var2;
    }
    UVar3 = '\0';
  }
  return UVar3;
}

Assistant:

UINT8 DROPlayer::UnloadFile(void)
{
	if (_playState & PLAYSTATE_PLAY)
		return 0xFF;
	
	_playState = 0x00;
	_dLoad = NULL;
	_fileData = NULL;
	_fileHdr.verMajor = 0xFF;
	_dataOfs = 0x00;
	_devTypes.clear();
	_devPanning.clear();
	_devices.clear();
	
	return 0x00;
}